

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

double cross_entropy<unsigned_int,unsigned_int>
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  pointer puVar9;
  pointer puVar10;
  ulong uVar11;
  ushort uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  undefined1 in_XMM7 [16];
  double local_38;
  double local_28;
  
  puVar9 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_28 = 0.0;
  local_38 = 0.0;
  if (puVar9 != puVar10) {
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    uVar11 = 0;
    auVar17 = vpbroadcastq_avx512f();
    auVar17 = vpsrlq_avx512f(auVar17,2);
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar21);
      auVar21 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar21,auVar17,2);
      bVar8 = (byte)uVar6;
      uVar12 = CONCAT11(bVar8,bVar7);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar9 + uVar11));
      auVar18._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar21._4_4_;
      auVar18._0_4_ = (uint)(bVar7 & 1) * auVar21._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar21._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar21._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar21._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar21._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar21._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar21._28_4_;
      auVar18._32_4_ = (uint)(bVar8 & 1) * auVar21._32_4_;
      auVar18._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar21._36_4_;
      auVar18._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar21._40_4_;
      auVar18._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar21._44_4_;
      auVar18._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar21._48_4_;
      auVar18._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar21._52_4_;
      auVar18._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar21._56_4_;
      auVar18._60_4_ = (uint)(bVar8 >> 7) * auVar21._60_4_;
      uVar11 = uVar11 + 0x10;
      auVar21 = vpaddd_avx512f(auVar18,auVar19);
    } while ((((ulong)((long)puVar10 + (-4 - (long)puVar9)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
             uVar11);
    auVar15 = vmovdqa32_avx512f(auVar21);
    auVar16._0_4_ = (uint)(bVar7 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._0_4_;
    bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * auVar19._4_4_;
    bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * auVar19._8_4_;
    bVar4 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * auVar19._12_4_;
    bVar4 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * auVar19._16_4_;
    bVar4 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * auVar19._20_4_;
    bVar4 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * auVar19._24_4_;
    bVar4 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * auVar19._28_4_;
    auVar16._32_4_ = (uint)(bVar8 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar19._32_4_;
    bVar4 = (bool)(bVar8 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar4 * auVar15._36_4_ | (uint)!bVar4 * auVar19._36_4_;
    bVar4 = (bool)(bVar8 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar4 * auVar15._40_4_ | (uint)!bVar4 * auVar19._40_4_;
    bVar4 = (bool)(bVar8 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar4 * auVar15._44_4_ | (uint)!bVar4 * auVar19._44_4_;
    bVar4 = (bool)(bVar8 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar4 * auVar15._48_4_ | (uint)!bVar4 * auVar19._48_4_;
    bVar4 = (bool)(bVar8 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar4 * auVar15._52_4_ | (uint)!bVar4 * auVar19._52_4_;
    bVar4 = (bool)(bVar8 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar4 * auVar15._56_4_ | (uint)!bVar4 * auVar19._56_4_;
    auVar16._60_4_ =
         (uint)(bVar8 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar19._60_4_;
    auVar14 = vextracti64x4_avx512f(auVar16,1);
    auVar15 = vpaddd_avx512f(auVar16,ZEXT3264(auVar14));
    auVar13 = vpaddd_avx(auVar15._0_16_,auVar15._16_16_);
    auVar5 = vpshufd_avx(auVar13,0xee);
    auVar13 = vpaddd_avx(auVar13,auVar5);
    auVar5 = vpshufd_avx(auVar13,0x55);
    auVar13 = vpaddd_avx(auVar13,auVar5);
    auVar13 = vcvtdq2pd_avx(auVar13);
    local_38 = auVar13._0_8_;
  }
  puVar2 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = vpbroadcastq_avx512f();
    auVar17 = vpsrlq_avx512f(auVar17,2);
    uVar11 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar21);
      auVar21 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar21,auVar17,2);
      bVar8 = (byte)uVar6;
      uVar12 = CONCAT11(bVar8,bVar7);
      auVar21 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar11));
      auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar21._4_4_;
      auVar20._0_4_ = (uint)(bVar7 & 1) * auVar21._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar21._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar21._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar21._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar21._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar21._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar21._28_4_;
      auVar20._32_4_ = (uint)(bVar8 & 1) * auVar21._32_4_;
      auVar20._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar21._36_4_;
      auVar20._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar21._40_4_;
      auVar20._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar21._44_4_;
      auVar20._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar21._48_4_;
      auVar20._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar21._52_4_;
      auVar20._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar21._56_4_;
      auVar20._60_4_ = (uint)(bVar8 >> 7) * auVar21._60_4_;
      uVar11 = uVar11 + 0x10;
      auVar21 = vpaddd_avx512f(auVar20,auVar19);
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0x7ffffffffffffff0) !=
             uVar11);
    auVar15 = vmovdqa32_avx512f(auVar21);
    auVar17._0_4_ = (uint)(bVar7 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._0_4_;
    bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * auVar19._4_4_;
    bVar4 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * auVar19._8_4_;
    bVar4 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * auVar19._12_4_;
    bVar4 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * auVar19._16_4_;
    bVar4 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * auVar19._20_4_;
    bVar4 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * auVar19._24_4_;
    bVar4 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * auVar19._28_4_;
    auVar17._32_4_ = (uint)(bVar8 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar19._32_4_;
    bVar4 = (bool)(bVar8 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar4 * auVar15._36_4_ | (uint)!bVar4 * auVar19._36_4_;
    bVar4 = (bool)(bVar8 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar4 * auVar15._40_4_ | (uint)!bVar4 * auVar19._40_4_;
    bVar4 = (bool)(bVar8 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar4 * auVar15._44_4_ | (uint)!bVar4 * auVar19._44_4_;
    bVar4 = (bool)(bVar8 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar4 * auVar15._48_4_ | (uint)!bVar4 * auVar19._48_4_;
    bVar4 = (bool)(bVar8 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar4 * auVar15._52_4_ | (uint)!bVar4 * auVar19._52_4_;
    bVar4 = (bool)(bVar8 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar4 * auVar15._56_4_ | (uint)!bVar4 * auVar19._56_4_;
    auVar17._60_4_ =
         (uint)(bVar8 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar19._60_4_;
    auVar14 = vextracti64x4_avx512f(auVar17,1);
    auVar15 = vpaddd_avx512f(auVar17,ZEXT3264(auVar14));
    auVar13 = vpaddd_avx(auVar15._0_16_,auVar15._16_16_);
    auVar5 = vpshufd_avx(auVar13,0xee);
    auVar13 = vpaddd_avx(auVar13,auVar5);
    auVar5 = vpshufd_avx(auVar13,0x55);
    auVar13 = vpaddd_avx(auVar13,auVar5);
    auVar13 = vcvtdq2pd_avx(auVar13);
    local_28 = auVar13._0_8_;
  }
  auVar13 = ZEXT816(0);
  auVar15 = ZEXT1664(auVar13);
  if (puVar9 != puVar10) {
    uVar11 = 0;
    do {
      if ((puVar9[uVar11] != 0) &&
         (uVar1 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar11], uVar1 != 0)) {
        auVar5 = vcvtusi2sd_avx512f(in_XMM7,puVar9[uVar11]);
        auVar13 = vcvtusi2sd_avx512f(in_XMM7,uVar1);
        auVar21._0_8_ = log2(auVar13._0_8_ / local_28);
        auVar21._8_56_ = extraout_var;
        puVar9 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar10 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auVar5._0_8_ / local_38;
        auVar13 = vfmadd231sd_fma(auVar15._0_16_,auVar21._0_16_,auVar13);
        auVar15 = ZEXT1664(auVar13);
      }
      auVar13 = auVar15._0_16_;
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)puVar10 - (long)puVar9 >> 2));
  }
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar13 = vxorpd_avx512vl(auVar13,auVar5);
  return auVar13._0_8_;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}